

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool __thiscall QApplication::event(QApplication *this,QEvent *e)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  WindowType WVar6;
  QApplicationPrivate *pQVar7;
  QWidget *pQVar8;
  QStyle *pQVar9;
  const_iterator o;
  QWidget **ppQVar10;
  QWindow *pQVar11;
  QEvent *this_00;
  QEvent *in_RSI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_3;
  QWidgetList *__range2_2;
  int sleepDelay;
  QStyle *s;
  bool showToolTip;
  QWidget *w_2;
  QTimerEvent *te;
  QWidget *w_1;
  QWidgetList *__range2_1;
  QWidget *w;
  QWidgetList *__range2;
  QApplicationPrivate *d;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  QWidgetList list_1;
  QHelpEvent e_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QWidgetList list;
  iterator __end2;
  iterator __begin2;
  QWidget *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  WidgetAttribute in_stack_fffffffffffffe74;
  QWidget *in_stack_fffffffffffffe78;
  QWidget *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe8c;
  QLocale *in_stack_fffffffffffffe90;
  QWidgetPrivate *in_stack_fffffffffffffe98;
  byte local_15d;
  undefined4 in_stack_fffffffffffffeb8;
  bool local_119;
  QWidgetPrivate *local_118;
  int local_ec;
  byte local_c1;
  const_iterator local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QLocale local_70;
  QWidget **local_68;
  const_iterator local_60;
  const_iterator local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  QWidget **local_38;
  iterator local_30;
  iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QApplication *)0x2ccece);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == Timer) {
    iVar4 = QTimerEvent::timerId((QTimerEvent *)0x2cd2c8);
    iVar5 = QBasicTimer::timerId((QBasicTimer *)0x2cd2e0);
    if (iVar4 == iVar5) {
      QBasicTimer::stop();
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2cd316);
      if (bVar1) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2cd333);
        local_118 = (QWidgetPrivate *)QWidget::window(in_stack_fffffffffffffe80);
        local_119 = QWidget::testAttribute(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
        while( true ) {
          iVar4 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
          local_15d = 0;
          if (local_118 != (QWidgetPrivate *)0x0) {
            local_15d = local_119 ^ 0xff;
          }
          if ((local_15d & 1) == 0) break;
          local_119 = QWidget::isActiveWindow((QWidget *)CONCAT44(TVar3,in_stack_fffffffffffffeb8));
          pQVar8 = QWidget::parentWidget((QWidget *)0x2cd3a0);
          if (pQVar8 == (QWidget *)0x0) {
            in_stack_fffffffffffffe98 = (QWidgetPrivate *)0x0;
            local_118 = in_stack_fffffffffffffe98;
          }
          else {
            in_stack_fffffffffffffe98 = (QWidgetPrivate *)QWidget::window(in_stack_fffffffffffffe80)
            ;
            local_118 = in_stack_fffffffffffffe98;
          }
        }
        if (local_119 != false) {
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          QHelpEvent::QHelpEvent
                    ((QHelpEvent *)&local_90,ToolTip,(QPoint *)&pQVar7->toolTipPos,
                     (QPoint *)&pQVar7->toolTipGlobalPos);
          pQVar8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2cd46d);
          QCoreApplication::sendEvent(&pQVar8->super_QObject,(QEvent *)&local_90);
          bVar1 = QEvent::isAccepted((QEvent *)&local_90);
          if (bVar1) {
            QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2cd4a4);
            pQVar9 = QWidget::style(in_stack_fffffffffffffe68);
            pQVar8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x2cd4cf);
            (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,99,0,pQVar8);
            QBasicTimer::start((QBasicTimer *)in_stack_fffffffffffffe80,iVar4,
                               &in_stack_fffffffffffffe78->super_QObject);
          }
          QHelpEvent::~QHelpEvent((QHelpEvent *)&local_90);
        }
      }
    }
    else {
      iVar4 = QTimerEvent::timerId((QTimerEvent *)0x2cd52c);
      iVar5 = QBasicTimer::timerId((QBasicTimer *)0x2cd544);
      if (iVar4 == iVar5) {
        QBasicTimer::stop();
      }
    }
    goto LAB_002cd6e8;
  }
  if (TVar3 == Quit) {
    closeAllWindows();
    topLevelWidgets();
    local_28[0].i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_28[0] = QList<QWidget_*>::begin
                            ((QList<QWidget_*> *)
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_30.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QWidget_*>::end
                         ((QList<QWidget_*> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    while( true ) {
      local_38 = local_30.i;
      bVar1 = QList<QWidget_*>::iterator::operator!=(local_28,local_30);
      if (!bVar1) break;
      ppQVar10 = QList<QWidget_*>::iterator::operator*(local_28);
      if ((((((*(uint *)&(*ppQVar10)->data->field_0x10 >> 9 & 1) == 0) &&
            (bVar1 = QWidget::isVisible((QWidget *)0x2cd046), bVar1)) &&
           (WVar6 = QWidget::windowType((QWidget *)
                                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                )), WVar6 != Desktop)) &&
          (WVar6 = QWidget::windowType((QWidget *)
                                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                                      ), WVar6 != Popup)) &&
         (((WVar6 = QWidget::windowType((QWidget *)
                                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                )), WVar6 != Dialog ||
           (pQVar8 = QWidget::parentWidget((QWidget *)0x2cd092), pQVar8 == (QWidget *)0x0)) &&
          (bVar1 = QWidget::testAttribute(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74),
          !bVar1)))) {
        QEvent::ignore(in_RSI);
        local_c1 = 1;
        local_ec = 1;
        goto LAB_002cd0e4;
      }
      QList<QWidget_*>::iterator::operator++(local_28);
    }
    local_ec = 3;
LAB_002cd0e4:
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cd0f1);
    if (local_ec != 1) {
      bVar2 = QCoreApplication::event(in_RDI);
      local_c1 = bVar2 & 1;
    }
    goto LAB_002cd703;
  }
  if ((TVar3 == ApplicationFontChange) || (TVar3 == ApplicationPaletteChange)) {
LAB_002cd57b:
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    topLevelWidgets();
    local_b0.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_b0 = QList<QWidget_*>::begin
                         ((QList<QWidget_*> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    o = QList<QWidget_*>::end
                  ((QList<QWidget_*> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                  );
    while (bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_b0,o), bVar1) {
      ppQVar10 = QList<QWidget_*>::const_iterator::operator*(&local_b0);
      pQVar8 = *ppQVar10;
      pQVar11 = QWidget::windowHandle
                          ((QWidget *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
      ;
      if ((pQVar11 == (QWindow *)0x0) &&
         (WVar6 = QWidget::windowType((QWidget *)
                                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
         , WVar6 != Desktop)) {
        this_00 = (QEvent *)operator_new(0x10);
        TVar3 = QEvent::type(in_RSI);
        QEvent::QEvent(this_00,TVar3);
        QCoreApplication::postEvent(&pQVar8->super_QObject,this_00,0);
      }
      QList<QWidget_*>::const_iterator::operator++(&local_b0);
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cd6e4);
  }
  else if (TVar3 == LocaleChange) {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    topLevelWidgets();
    local_58.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QWidget_*>::begin
                         ((QList<QWidget_*> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_60.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = QList<QWidget_*>::end
                         ((QList<QWidget_*> *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    while( true ) {
      local_68 = local_60.i;
      bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_58,local_60);
      if (!bVar1) break;
      QList<QWidget_*>::const_iterator::operator*(&local_58);
      WVar6 = QWidget::windowType((QWidget *)
                                  CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if ((WVar6 != Desktop) &&
         (bVar1 = QWidget::testAttribute(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74),
         !bVar1)) {
        QWidget::d_func((QWidget *)0x2cd242);
        QLocale::QLocale(&local_70);
        QWidgetPrivate::setLocale_helper
                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   SUB41((uint)in_stack_fffffffffffffe8c >> 0x18,0));
        QLocale::~QLocale(&local_70);
      }
      QList<QWidget_*>::const_iterator::operator++(&local_58);
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cd2a6);
  }
  else {
    if (TVar3 == LanguageChange) goto LAB_002cd57b;
    if (TVar3 == EnterWhatsThisMode) {
      QWhatsThis::enterWhatsThisMode();
      local_c1 = 1;
      goto LAB_002cd703;
    }
  }
LAB_002cd6e8:
  bVar2 = QGuiApplication::event(in_RDI);
  local_c1 = bVar2 & 1;
LAB_002cd703:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_c1 & 1);
}

Assistant:

bool QApplication::event(QEvent *e)
{
    Q_D(QApplication);
    switch (e->type()) {
    case QEvent::Quit:
        // FIXME: This logic first tries to close all windows, and then
        // checks whether it was successful, but the conditions used in
        // closeAllWindows() differ from the verification logic below.
        // We should build on the logic in tryCloseAllWidgetWindows().
        closeAllWindows();
        for (auto *w : topLevelWidgets()) {
            if (w->data->is_closing)
                continue;
            if (w->isVisible() && !(w->windowType() == Qt::Desktop) && !(w->windowType() == Qt::Popup) &&
                 (!(w->windowType() == Qt::Dialog) || !w->parentWidget()) && !w->testAttribute(Qt::WA_DontShowOnScreen)) {
                e->ignore();
                return true;
            }
        }
        // Explicitly call QCoreApplication instead of QGuiApplication so that
        // we don't let QGuiApplication close any windows we skipped earlier in
        // closeAllWindows(). FIXME: Unify all this close magic through closeAllWindows.
        return QCoreApplication::event(e);
#ifndef Q_OS_WIN
    case QEvent::LocaleChange: {
        // on Windows the event propagation is taken care by the
        // WM_SETTINGCHANGE event handler.
        const QWidgetList list = topLevelWidgets();
        for (auto *w : list) {
            if (!(w->windowType() == Qt::Desktop)) {
                if (!w->testAttribute(Qt::WA_SetLocale))
                    w->d_func()->setLocale_helper(QLocale(), true);
            }
        }
        break;
    }
#endif
    case QEvent::Timer: {
        QTimerEvent *te = static_cast<QTimerEvent*>(e);
        Q_ASSERT(te != nullptr);
        if (te->timerId() == d->toolTipWakeUp.timerId()) {
            d->toolTipWakeUp.stop();
            if (d->toolTipWidget) {
                QWidget *w = d->toolTipWidget->window();
                // show tooltip if WA_AlwaysShowToolTips is set, or if
                // any ancestor of d->toolTipWidget is the active
                // window
                bool showToolTip = w->testAttribute(Qt::WA_AlwaysShowToolTips);
                while (w && !showToolTip) {
                    showToolTip = w->isActiveWindow();
                    w = w->parentWidget();
                    w = w ? w->window() : nullptr;
                }
                if (showToolTip) {
                    QHelpEvent e(QEvent::ToolTip, d->toolTipPos, d->toolTipGlobalPos);
                    QCoreApplication::sendEvent(d->toolTipWidget, &e);
                    if (e.isAccepted()) {
                        QStyle *s = d->toolTipWidget->style();
                        int sleepDelay = s->styleHint(QStyle::SH_ToolTip_FallAsleepDelay, nullptr, d->toolTipWidget, nullptr);
                        d->toolTipFallAsleep.start(sleepDelay, this);
                    }
                }
            }
        } else if (te->timerId() == d->toolTipFallAsleep.timerId()) {
            d->toolTipFallAsleep.stop();
        }
        break;
    }
#if QT_CONFIG(whatsthis)
    case QEvent::EnterWhatsThisMode:
        QWhatsThis::enterWhatsThisMode();
        return true;
#endif
    case QEvent::LanguageChange:
    case QEvent::ApplicationFontChange:
    case QEvent::ApplicationPaletteChange: {
        // QGuiApplication::event does not account for the cases where
        // there is a top level widget without a window handle. So they
        // need to have the event posted here
        const QWidgetList list = topLevelWidgets();
        for (auto *w : list) {
            if (!w->windowHandle() && (w->windowType() != Qt::Desktop))
                postEvent(w, new QEvent(e->type()));
        }
        break;
    }
    default:
        break;
    }

    return QGuiApplication::event(e);
}